

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O3

void __thiscall QSynth::setReversedStereoEnabled(QSynth *this,bool enabled)

{
  QMutex *pQVar1;
  bool bVar2;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setReversedStereoEnabled(this->realtimeHelper,enabled);
    return;
  }
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::lockInternal();
    }
  }
  if (this->state == SynthState_OPEN) {
    MT32Emu::Synth::setReversedStereoEnabled(this->synth,enabled);
  }
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void QSynth::setReversedStereoEnabled(bool enabled) {
	if (isRealtime()) {
		realtimeHelper->setReversedStereoEnabled(enabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setReversedStereoEnabled(enabled);
	}
}